

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

void __thiscall
r_exec::HLPController::inject_prediction(HLPController *this,Fact *prediction,double confidence)

{
  Group *destination;
  View *this_00;
  uint64_t ijt;
  _Mem *this_01;
  float fVar1;
  View *view;
  float sln_thr;
  Code *primary_host;
  double confidence_local;
  Fact *prediction_local;
  HLPController *this_local;
  
  destination = get_host(this);
  (*(destination->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
    super_Code.super__Object._vptr__Object[4])();
  fVar1 = (float)r_code::Atom::asFloat();
  if ((double)fVar1 < confidence) {
    this_00 = (View *)operator_new(0x100);
    ijt = (*Now)();
    View::View(this_00,SYNC_ONCE,ijt,confidence,1,(Code *)destination,(Code *)destination,
               (Code *)prediction);
    this_01 = _Mem::Get();
    _Mem::inject(this_01,this_00);
  }
  return;
}

Assistant:

void HLPController::inject_prediction(Fact *prediction, double confidence) const   // prediction is simulated: f->pred->f->target.
{
    Code *primary_host = get_host();
    float sln_thr = primary_host->code(GRP_SLN_THR).asFloat();

    if (confidence > sln_thr) { // do not inject if cfd is too low.
        View *view = new View(View::SYNC_ONCE, Now(), confidence, 1, primary_host, primary_host, prediction); // SYNC_ONCE,res=1.
        _Mem::Get()->inject(view);
    }
}